

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O0

void __thiscall
ScriptMemoryDumper::
DumpHeapBucket<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (ScriptMemoryDumper *this,uint index,
          HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket)

{
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  TBlockAllocatorType *pTVar1;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  *local_28;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  *currentAllocator;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket_local
  ;
  uint index_local;
  ScriptMemoryDumper *this_local;
  
  local_28 = Memory::
             HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
             GetAllocator(heapBucket);
  do {
    heapBlock = Memory::
                SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                ::GetHeapBlock(local_28);
    DumpSmallHeapBlock<SmallAllocationBlockAttributes>
              (this,(SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock);
    local_28 = Memory::
               SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
               ::GetNext(local_28);
    pTVar1 = Memory::
             HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
             GetAllocator(heapBucket);
  } while (local_28 != pTVar1);
  DumpSmallHeapBlockList<SmallAllocationBlockAttributes>
            (this,(SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBucket->fullBlockList);
  DumpSmallHeapBlockList<SmallAllocationBlockAttributes>
            (this,(SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBucket->heapBlockList);
  return;
}

Assistant:

void ScriptMemoryDumper::DumpHeapBucket(uint index, HeapBucketT<TBlockType>* heapBucket)
{
    SmallHeapBlockAllocator<TBlockType> * currentAllocator = heapBucket->GetAllocator();
    do
    {
        DumpSmallHeapBlock(currentAllocator->GetHeapBlock());
        currentAllocator = currentAllocator->GetNext();
    }
    while (currentAllocator != heapBucket->GetAllocator());

    DumpSmallHeapBlockList(heapBucket->fullBlockList);
    DumpSmallHeapBlockList(heapBucket->heapBlockList);
}